

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

void mbedtls_mpi_core_exp_mod
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,mbedtls_mpi_uint *RR,mbedtls_mpi_uint *T)

{
  mbedtls_mpi_core_exp_mod_optionally_safe(X,A,N,AN_limbs,E,E_limbs,0,RR,T);
  return;
}

Assistant:

void mbedtls_mpi_core_exp_mod(mbedtls_mpi_uint *X,
                              const mbedtls_mpi_uint *A,
                              const mbedtls_mpi_uint *N, size_t AN_limbs,
                              const mbedtls_mpi_uint *E, size_t E_limbs,
                              const mbedtls_mpi_uint *RR,
                              mbedtls_mpi_uint *T)
{
    mbedtls_mpi_core_exp_mod_optionally_safe(X,
                                             A,
                                             N,
                                             AN_limbs,
                                             E,
                                             E_limbs,
                                             MBEDTLS_MPI_IS_SECRET,
                                             RR,
                                             T);
}